

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::NodeIntLoadResidual_Mv
          (ChNodeFEAxyzDDD *this,uint off,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  CoeffReturnType pdVar15;
  Scalar *pSVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  
  dVar17 = c;
  (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
    _vptr_ChNodeFEAbase[9])();
  dVar17 = dVar17 * c;
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,(ulong)off);
  dVar1 = *pdVar15;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,(ulong)off);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar17;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pSVar16;
  auVar2 = vfmadd213sd_fma(auVar30,auVar18,auVar2);
  *pSVar16 = auVar2._0_8_;
  (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
    _vptr_ChNodeFEAbase[9])(this);
  dVar17 = dVar17 * c;
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 1));
  dVar1 = *pdVar15;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 1));
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar17;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *pSVar16;
  auVar2 = vfmadd213sd_fma(auVar31,auVar19,auVar3);
  *pSVar16 = auVar2._0_8_;
  (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
    _vptr_ChNodeFEAbase[9])(this);
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 2));
  dVar1 = *pdVar15;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 2));
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar17 * c;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *pSVar16;
  auVar2 = vfmadd213sd_fma(auVar32,auVar20,auVar4);
  *pSVar16 = auVar2._0_8_;
  iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase
             ._vptr_ChNodeFEAbase[0x23])(this);
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var,iVar14),0);
  dVar1 = *pSVar16;
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 3));
  dVar17 = *pdVar15;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 3));
  auVar21._8_8_ = 0;
  auVar21._0_8_ = c * dVar1;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar17;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *pSVar16;
  auVar2 = vfmadd213sd_fma(auVar33,auVar21,auVar5);
  *pSVar16 = auVar2._0_8_;
  iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase
             ._vptr_ChNodeFEAbase[0x23])(this);
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_00,iVar14),1);
  dVar1 = *pSVar16;
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 4));
  dVar17 = *pdVar15;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 4));
  auVar22._8_8_ = 0;
  auVar22._0_8_ = c * dVar1;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar17;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *pSVar16;
  auVar2 = vfmadd213sd_fma(auVar34,auVar22,auVar6);
  *pSVar16 = auVar2._0_8_;
  iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase
             ._vptr_ChNodeFEAbase[0x23])(this);
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_01,iVar14),2);
  dVar1 = *pSVar16;
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 5));
  dVar17 = *pdVar15;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 5));
  auVar23._8_8_ = 0;
  auVar23._0_8_ = c * dVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar17;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *pSVar16;
  auVar2 = vfmadd213sd_fma(auVar35,auVar23,auVar7);
  *pSVar16 = auVar2._0_8_;
  iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase
             ._vptr_ChNodeFEAbase[0x2e])(this);
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_02,iVar14),0);
  dVar1 = *pSVar16;
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 6));
  dVar17 = *pdVar15;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 6));
  auVar24._8_8_ = 0;
  auVar24._0_8_ = c * dVar1;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar17;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *pSVar16;
  auVar2 = vfmadd213sd_fma(auVar36,auVar24,auVar8);
  *pSVar16 = auVar2._0_8_;
  iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase
             ._vptr_ChNodeFEAbase[0x2e])(this);
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_03,iVar14),1);
  dVar1 = *pSVar16;
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 7));
  dVar17 = *pdVar15;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 7));
  auVar25._8_8_ = 0;
  auVar25._0_8_ = c * dVar1;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar17;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *pSVar16;
  auVar2 = vfmadd213sd_fma(auVar37,auVar25,auVar9);
  *pSVar16 = auVar2._0_8_;
  iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase
             ._vptr_ChNodeFEAbase[0x2e])(this);
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_04,iVar14),2);
  dVar1 = *pSVar16;
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 8));
  dVar17 = *pdVar15;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 8));
  auVar26._8_8_ = 0;
  auVar26._0_8_ = c * dVar1;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar17;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *pSVar16;
  auVar2 = vfmadd213sd_fma(auVar38,auVar26,auVar10);
  *pSVar16 = auVar2._0_8_;
  iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase
             ._vptr_ChNodeFEAbase[0x2f])(this);
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_05,iVar14),0);
  dVar1 = *pSVar16;
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 9));
  dVar17 = *pdVar15;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 9));
  auVar27._8_8_ = 0;
  auVar27._0_8_ = c * dVar1;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar17;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *pSVar16;
  auVar2 = vfmadd213sd_fma(auVar39,auVar27,auVar11);
  *pSVar16 = auVar2._0_8_;
  iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase
             ._vptr_ChNodeFEAbase[0x2f])(this);
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_06,iVar14),1);
  dVar1 = *pSVar16;
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 10));
  dVar17 = *pdVar15;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 10));
  auVar28._8_8_ = 0;
  auVar28._0_8_ = c * dVar1;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar17;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *pSVar16;
  auVar2 = vfmadd213sd_fma(auVar40,auVar28,auVar12);
  *pSVar16 = auVar2._0_8_;
  iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase
             ._vptr_ChNodeFEAbase[0x2f])(this);
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       CONCAT44(extraout_var_07,iVar14),2);
  dVar1 = *pSVar16;
  pdVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                       (ulong)(off + 0xb));
  dVar17 = *pdVar15;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                       (ulong)(off + 0xb));
  auVar29._8_8_ = 0;
  auVar29._0_8_ = c * dVar1;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar17;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *pSVar16;
  auVar2 = vfmadd213sd_fma(auVar41,auVar29,auVar13);
  *pSVar16 = auVar2._0_8_;
  return;
}

Assistant:

void ChNodeFEAxyzDDD::NodeIntLoadResidual_Mv(const unsigned int off,
                                            ChVectorDynamic<>& R,
                                            const ChVectorDynamic<>& w,
                                            const double c) {
    R(off + 0) += c * GetMass() * w(off + 0);
    R(off + 1) += c * GetMass() * w(off + 1);
    R(off + 2) += c * GetMass() * w(off + 2);
    R(off + 3) += c * GetMassDiagonal()(0) * w(off + 3);  // unuseful? mass for D isalways zero..
    R(off + 4) += c * GetMassDiagonal()(1) * w(off + 4);
    R(off + 5) += c * GetMassDiagonal()(2) * w(off + 5);
    R(off + 6) += c * GetMassDiagonalDD()(0) * w(off + 6);
    R(off + 7) += c * GetMassDiagonalDD()(1) * w(off + 7);
    R(off + 8) += c * GetMassDiagonalDD()(2) * w(off + 8);
    R(off + 9) += c * GetMassDiagonalDDD()(0) * w(off + 9);
    R(off + 10) += c * GetMassDiagonalDDD()(1) * w(off + 10);
    R(off + 11) += c * GetMassDiagonalDDD()(2) * w(off + 11);
}